

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

string * __thiscall
duckdb::EnumType::GetValue_abi_cxx11_(string *__return_storage_ptr__,EnumType *this,Value *val)

{
  uint32_t uVar1;
  ExtraTypeInfo *pEVar2;
  string *psVar3;
  optional_ptr<duckdb::ExtraTypeInfo,_true> info;
  optional_ptr<duckdb::ExtraTypeInfo,_true> local_60;
  Value local_58;
  
  local_60.ptr = *(ExtraTypeInfo **)(this + 8);
  pEVar2 = optional_ptr<duckdb::ExtraTypeInfo,_true>::operator->(&local_60);
  uVar1 = Value::GetValue<unsigned_int>((Value *)this);
  Vector::GetValue(&local_58,(Vector *)(pEVar2 + 1),(ulong)uVar1);
  psVar3 = StringValue::Get_abi_cxx11_(&local_58);
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
  Value::~Value(&local_58);
  return __return_storage_ptr__;
}

Assistant:

const string EnumType::GetValue(const Value &val) {
	auto info = val.type().AuxInfo();
	auto &values_insert_order = info->Cast<EnumTypeInfo>().GetValuesInsertOrder();
	return StringValue::Get(values_insert_order.GetValue(val.GetValue<uint32_t>()));
}